

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixRandomAccessFile::Read
          (PosixRandomAccessFile *this,uint64_t offset,size_t n,Slice *result,char *scratch)

{
  char *__file;
  int *piVar1;
  char *in_R9;
  size_t local_a8;
  Status local_70;
  Slice local_68 [2];
  size_t local_48;
  ssize_t read_size;
  char *pcStack_38;
  int fd;
  char *scratch_local;
  Slice *result_local;
  size_t n_local;
  uint64_t offset_local;
  PosixRandomAccessFile *this_local;
  Status *status;
  
  read_size._4_4_ = *(int *)(offset + 0xc);
  pcStack_38 = in_R9;
  scratch_local = scratch;
  result_local = result;
  n_local = n;
  offset_local = offset;
  this_local = this;
  if ((*(byte *)(offset + 8) & 1) == 0) {
    __file = (char *)std::__cxx11::string::c_str();
    read_size._4_4_ = open(__file,0x80000);
    if (read_size._4_4_ < 0) {
      piVar1 = __errno_location();
      PosixError((anon_unknown_1 *)this,(string *)(offset + 0x18),*piVar1);
      return (Status)(char *)this;
    }
  }
  if (read_size._4_4_ != -1) {
    read_size._3_1_ = 0;
    Status::Status((Status *)this);
    local_48 = pread(read_size._4_4_,pcStack_38,(size_t)result_local,n_local);
    local_a8 = local_48;
    if ((long)local_48 < 0) {
      local_a8 = 0;
    }
    Slice::Slice(local_68,pcStack_38,local_a8);
    *(char **)scratch_local = local_68[0].data_;
    *(size_t *)(scratch_local + 8) = local_68[0].size_;
    if ((long)local_48 < 0) {
      piVar1 = __errno_location();
      PosixError((anon_unknown_1 *)&local_70,(string *)(offset + 0x18),*piVar1);
      Status::operator=((Status *)this,&local_70);
      Status::~Status(&local_70);
    }
    if ((*(byte *)(offset + 8) & 1) == 0) {
      if (read_size._4_4_ == *(int *)(offset + 0xc)) {
        __assert_fail("fd != fd_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_posix.cc"
                      ,0xc0,
                      "virtual Status leveldb::(anonymous namespace)::PosixRandomAccessFile::Read(uint64_t, size_t, Slice *, char *) const"
                     );
      }
      close(read_size._4_4_);
    }
    return (Status)(char *)this;
  }
  __assert_fail("fd != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_posix.cc"
                ,0xb5,
                "virtual Status leveldb::(anonymous namespace)::PosixRandomAccessFile::Read(uint64_t, size_t, Slice *, char *) const"
               );
}

Assistant:

Status Read(uint64_t offset, size_t n, Slice* result,
              char* scratch) const override {
    int fd = fd_;
    if (!has_permanent_fd_) {
      fd = ::open(filename_.c_str(), O_RDONLY | kOpenBaseFlags);
      if (fd < 0) {
        return PosixError(filename_, errno);
      }
    }

    assert(fd != -1);

    Status status;
    ssize_t read_size = ::pread(fd, scratch, n, static_cast<off_t>(offset));
    *result = Slice(scratch, (read_size < 0) ? 0 : read_size);
    if (read_size < 0) {
      // An error: return a non-ok status.
      status = PosixError(filename_, errno);
    }
    if (!has_permanent_fd_) {
      // Close the temporary file descriptor opened earlier.
      assert(fd != fd_);
      ::close(fd);
    }
    return status;
  }